

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::loadTimeMonitor(CoreBroker *this,bool firstLoad,string_view newFederate)

{
  BrokerState BVar1;
  pointer pcVar2;
  size_type sVar3;
  string_view message;
  string_view message_00;
  string_view message_01;
  int iVar4;
  GlobalFederateId GVar5;
  iterator iVar6;
  char *__s;
  size_t __n;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  size_type __rlen;
  pointer pBVar7;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  ActionMessage timeMarkerRem;
  string local_160;
  pointer local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_138;
  size_t local_130;
  char *pcStack_128;
  undefined8 local_120;
  char *pcStack_118;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [10];
  pointer local_58;
  size_type sStack_50;
  char *local_48;
  size_t local_40;
  
  __s = newFederate._M_str;
  __n = newFederate._M_len;
  if (((__n != 0) && ((this->mTimeMonitorFederate)._M_string_length == __n)) &&
     (iVar4 = bcmp(__s,(this->mTimeMonitorFederate)._M_dataplus._M_p,__n), iVar4 == 0)) {
    return;
  }
  if (((firstLoad) || (iVar4 = (this->mTimeMonitorFederateId).gid, iVar4 == -2010000000)) ||
     ((iVar4 == -1700000000 || (__n != 0)))) {
    BVar1 = (this->super_BrokerBase).brokerState._M_i;
    if (BVar1 != OPERATING && !firstLoad) {
      if (INITIALIZING < BVar1 || __n == 0) {
        return;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->mTimeMonitorFederate,0,(this->mTimeMonitorFederate)._M_string_length,__s,__n
                );
      return;
    }
    if (((BVar1 == OPERATING && !firstLoad) &&
        (iVar4 = (this->mTimeMonitorFederateId).gid, iVar4 != -2010000000)) &&
       (iVar4 != -1700000000)) {
      ActionMessage::ActionMessage((ActionMessage *)local_110,cmd_remove_dependent);
      local_100[0]._0_4_ = (this->mTimeMonitorFederateId).gid;
      local_110._8_4_ = (this->mTimeMonitorLocalFederateId).gid;
      routeMessage(this,(ActionMessage *)local_110);
      (this->mTimeMonitorFederateId).gid = -2010000000;
      if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        GVar5.gid = (this->super_BrokerBase).global_broker_id_local.gid;
        pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        sVar3 = (this->super_BrokerBase).identifier._M_string_length;
        local_58 = (this->mTimeMonitorFederate)._M_dataplus._M_p;
        sStack_50 = (this->mTimeMonitorFederate)._M_string_length;
        fmt.size_ = 0xdd;
        fmt.data_ = (char *)0x2d;
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_58;
        local_48 = __s;
        local_40 = __n;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_160,(v11 *)" changing time monitor federate from {} to {}",fmt,args);
        local_130 = local_160._M_string_length;
        pcStack_128 = local_160._M_dataplus._M_p;
        in_R9.values_ = (value<fmt::v11::context> *)0x0;
        message._M_str = local_160._M_dataplus._M_p;
        message._M_len = local_160._M_string_length;
        name._M_str = pcVar2;
        name._M_len = sVar3;
        BrokerBase::sendToLogger(&this->super_BrokerBase,GVar5,6,name,message,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_110);
    }
    if (__n != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &this->mTimeMonitorFederate,0,(this->mTimeMonitorFederate)._M_string_length,__s,__n
                );
    }
    local_110._8_8_ = (this->mTimeMonitorFederate)._M_dataplus._M_p;
    local_110._0_8_ = (this->mTimeMonitorFederate)._M_string_length;
    iVar6 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(this->mFederates).lookup1,(key_type *)local_110);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar7 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar7 = (this->mFederates).dataStorage.
               super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
               _M_impl.super__Vector_impl_data._M_start +
               *(long *)((long)iVar6.
                               super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                               ._M_cur + 0x18);
    }
    if (pBVar7 == (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      GVar5.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar2 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar3 = (this->super_BrokerBase).identifier._M_string_length;
      local_58 = (this->mTimeMonitorFederate)._M_dataplus._M_p;
      sStack_50 = (this->mTimeMonitorFederate)._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = &DAT_00000020;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_58;
      ::fmt::v11::vformat_abi_cxx11_
                ((string *)local_110,(v11 *)" unrecognized timing federate {}",fmt_00,args_00);
      local_140 = (pointer)local_110._8_8_;
      paStack_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._0_8_;
      message_00._M_str = (char *)local_110._0_8_;
      message_00._M_len = local_110._8_8_;
      name_00._M_str = pcVar2;
      name_00._M_len = sVar3;
      BrokerBase::sendToLogger(&this->super_BrokerBase,GVar5,3,name_00,message_00,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._0_8_ == local_100) {
        return;
      }
      operator_delete((void *)local_110._0_8_,
                      CONCAT44(local_100[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_100[0]._M_allocated_capacity) + 1);
      return;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_110,cmd_add_dependent);
    local_100[0]._0_4_ = (pBVar7->global_id).gid;
    (this->mTimeMonitorFederateId).gid = local_100[0]._0_4_;
    (this->mTimeMonitorLastLogTime).internalTimeCode = -0x7fffffffffffffff;
    iVar4 = (this->super_BrokerBase).global_broker_id_local.gid;
    GVar5.gid = 0x6fffffff;
    if (iVar4 != 1) {
      GVar5.gid = iVar4 * -3 + -0x40000006;
    }
    (this->mTimeMonitorLocalFederateId).gid = GVar5.gid;
    local_110._8_4_ = GVar5.gid;
    routeMessage(this,(ActionMessage *)local_110);
  }
  else {
    ActionMessage::ActionMessage((ActionMessage *)local_110,cmd_remove_dependent);
    local_100[0]._0_4_ = (this->mTimeMonitorFederateId).gid;
    local_110._8_4_ = (this->mTimeMonitorLocalFederateId).gid;
    routeMessage(this,(ActionMessage *)local_110);
    (this->mTimeMonitorFederateId).gid = -2010000000;
    if (5 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
      local_120 = 0x23;
      pcStack_118 = " disconnected time monitor federate";
      message_01._M_str = " disconnected time monitor federate";
      message_01._M_len = 0x23;
      name_01._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      name_01._M_len = (this->super_BrokerBase).identifier._M_string_length;
      BrokerBase::sendToLogger
                (&this->super_BrokerBase,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,6,name_01,
                 message_01,false);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &this->mTimeMonitorFederate,0,(this->mTimeMonitorFederate)._M_string_length,__s,0);
  }
  ActionMessage::~ActionMessage((ActionMessage *)local_110);
  return;
}

Assistant:

void CoreBroker::loadTimeMonitor(bool firstLoad, std::string_view newFederate)
{
    if (!newFederate.empty() && newFederate == mTimeMonitorFederate) {
        return;
    }
    if (!firstLoad && mTimeMonitorFederateId.isValid() && newFederate.empty()) {
        // do a disconnect
        ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
        timeMarkerRem.dest_id = mTimeMonitorFederateId;
        timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
        routeMessage(timeMarkerRem);
        mTimeMonitorFederateId = GlobalFederateId{};
        LOG_SUMMARY(global_broker_id_local, getIdentifier(), " disconnected time monitor federate");
        mTimeMonitorFederate = newFederate;
        return;
    }
    auto cState = getBrokerState();
    if (cState == BrokerState::OPERATING || firstLoad) {
        if (cState == BrokerState::OPERATING && !firstLoad) {
            if (mTimeMonitorFederateId.isValid()) {
                // do a disconnect
                ActionMessage timeMarkerRem(CMD_REMOVE_DEPENDENT);
                timeMarkerRem.dest_id = mTimeMonitorFederateId;
                timeMarkerRem.source_id = mTimeMonitorLocalFederateId;
                routeMessage(timeMarkerRem);
                mTimeMonitorFederateId = GlobalFederateId{};
                LOG_SUMMARY(global_broker_id_local,
                            getIdentifier(),
                            fmt::format(" changing time monitor federate from {} to {}",
                                        mTimeMonitorFederate,
                                        newFederate));
            }
        }
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
        auto fed = mFederates.find(mTimeMonitorFederate);
        if (fed != mFederates.end()) {
            ActionMessage timeMarker(CMD_ADD_DEPENDENT);
            timeMarker.dest_id = fed->global_id;

            mTimeMonitorFederateId = fed->global_id;
            mTimeMonitorLastLogTime = Time::minVal();
            mTimeMonitorLocalFederateId = getSpecialFederateId(global_broker_id_local, 0);
            timeMarker.source_id = mTimeMonitorLocalFederateId;
            routeMessage(timeMarker);
        } else {
            LOG_WARNING(global_broker_id_local,
                        getIdentifier(),
                        fmt::format(" unrecognized timing federate {}", mTimeMonitorFederate));
        }
    } else if (cState < BrokerState::OPERATING) {
        if (!newFederate.empty()) {
            mTimeMonitorFederate = newFederate;
        }
    }
}